

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowMaxAbsUnscaled
          (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,int i)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  element_type *this_00;
  int in_ECX;
  int __c;
  long in_RSI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  Real eps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  abs;
  int j;
  int exp2;
  int exp1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rowVec;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *max;
  undefined4 in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd6c;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd70;
  cpp_dec_float<50U,_int,_void> *this_01;
  double in_stack_fffffffffffffd78;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffd80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *a;
  undefined4 in_stack_fffffffffffffda8;
  uint exp;
  undefined1 local_214 [56];
  undefined1 local_1dc [56];
  undefined1 local_1a4 [112];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_134;
  undefined1 local_fc [56];
  uint local_c4;
  int local_c0;
  int local_bc;
  undefined8 local_b8;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_b0;
  DataArray<int> *local_a8;
  cpp_dec_float<50U,_int,_void> *local_a0;
  int local_94;
  undefined8 local_78;
  undefined8 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined8 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *local_18;
  undefined1 *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *local_8;
  
  local_a0 = *(cpp_dec_float<50U,_int,_void> **)(in_RSI + 0x10);
  local_a8 = *(DataArray<int> **)(in_RSI + 0x18);
  local_94 = in_ECX;
  local_b0 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::rowVector(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
  local_b8 = 0;
  local_70 = &local_b8;
  local_78 = 0;
  local_20 = local_70;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  piVar3 = DataArray<int>::operator[](local_a8,local_94);
  local_c0 = *piVar3;
  local_c4 = 0;
  while (exp = local_c4,
        iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_b0), (int)exp < iVar2) {
    this_01 = local_a0;
    pcVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::index(local_b0,(char *)(ulong)local_c4,__c);
    piVar3 = DataArray<int>::operator[]((DataArray<int> *)this_01,(int)pcVar4);
    local_bc = *piVar3;
    local_60 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::value(local_b0,local_c4);
    local_58 = local_1a4;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (this_01,(cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (in_RDI,exp);
    a = &local_134;
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
              (a);
    local_18 = a;
    local_10 = local_fc;
    local_8 = a;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (this_01,(cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_48 = local_1dc;
    local_50 = local_fc;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (this_01,(cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    local_38 = local_214;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              (this_01,(cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    tolerances((SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3b34e9);
    eps = Tolerances::epsilon(this_00);
    bVar1 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (in_RDI,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(exp,in_stack_fffffffffffffda8),eps);
    in_stack_fffffffffffffd6c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd6c);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3b3524);
    if ((in_stack_fffffffffffffd6c & 0x1000000) != 0) {
      local_30 = local_fc;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (this_01,(cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    }
    local_c4 = local_c4 + 1;
  }
  return in_RDI;
}

Assistant:

R SPxScaler<R>::getRowMaxAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nRows());
   assert(i >= 0);
   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& rowVec = lp.LPRowSetBase<R>::rowVector(i);

   R max = 0.0;

   int exp1;
   int exp2 = rowscaleExp[i];

   for(int j = 0; j < rowVec.size(); j++)
   {
      exp1 = colscaleExp[rowVec.index(j)];
      R abs = spxAbs(spxLdexp(rowVec.value(j), -exp1 - exp2));

      if(GT(abs, max, this->tolerances()->epsilon()))
         max = abs;
   }

   return max;
}